

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addReadOnlyIntegerHandler(SNMPAgent *this,char *oid,int value,bool overwritePrefix)

{
  SortableOIDType *oid_00;
  StaticIntegerCallback *this_00;
  SortableOIDType *oidType;
  bool overwritePrefix_local;
  int value_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
  if (oid_00 == (SortableOIDType *)0x0) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    this_00 = (StaticIntegerCallback *)operator_new(0x20);
    StaticIntegerCallback::StaticIntegerCallback(this_00,oid_00,value);
    this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,false);
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addReadOnlyIntegerHandler(const char *oid, int value, bool overwritePrefix){
    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) {
        return nullptr;
    }
    return addHandler(new StaticIntegerCallback(oidType, value), false);
}